

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O0

any * __thiscall hwnet::TCPSocket::GetUserData(TCPSocket *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> guard;
  TCPSocket *this_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mtx);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return &this->ud;
}

Assistant:

const any& GetUserData() const {
		std::lock_guard<std::mutex> guard(this->mtx);
		return this->ud;
	}